

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::writeEncryptionDictionary(QPDFWriter *this)

{
  element_type *peVar1;
  int iVar2;
  _Base_ptr p_Var3;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  
  iVar2 = openObject(this,((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->encryption_dict_objid);
  ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  encryption_dict_objid = iVar2;
  str._M_str = "<<";
  str._M_len = 2;
  writeString(this,str);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (p_Var3 = *(_Base_ptr *)
                 ((long)&(peVar1->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var3 != &(peVar1->encryption_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    str_00._M_str = " ";
    str_00._M_len = 1;
    writeString(this,str_00);
    str_01._M_str = *(char **)(p_Var3 + 1);
    str_01._M_len = (size_t)p_Var3[1]._M_parent;
    writeString(this,str_01);
    str_02._M_str = " ";
    str_02._M_len = 1;
    writeString(this,str_02);
    str_03._M_str = *(char **)(p_Var3 + 2);
    str_03._M_len = (size_t)p_Var3[2]._M_parent;
    writeString(this,str_03);
  }
  str_04._M_str = " >>";
  str_04._M_len = 3;
  writeString(this,str_04);
  closeObject(this,((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->encryption_dict_objid);
  return;
}

Assistant:

void
QPDFWriter::writeEncryptionDictionary()
{
    m->encryption_dict_objid = openObject(m->encryption_dict_objid);
    writeString("<<");
    for (auto const& iter: m->encryption_dictionary) {
        writeString(" ");
        writeString(iter.first);
        writeString(" ");
        writeString(iter.second);
    }
    writeString(" >>");
    closeObject(m->encryption_dict_objid);
}